

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

cl_int __thiscall
CLIntercept::autoPartitionGetDeviceIDs
          (CLIntercept *this,cl_platform_id platform,cl_device_type device_type,cl_uint num_entries,
          cl_device_id *devices,cl_uint *num_devices)

{
  pthread_mutex_t *__mutex;
  pointer pp_Var1;
  byte bVar2;
  int iVar3;
  mapped_type *this_00;
  pointer pp_Var4;
  _cl_device_id *p_Var5;
  ulong uVar6;
  undefined8 uVar7;
  pointer pp_Var8;
  ulong uVar9;
  pointer pp_Var10;
  float extraout_XMM0_Da;
  float __x;
  float extraout_XMM0_Da_00;
  float __x_00;
  float extraout_XMM0_Da_01;
  float __x_01;
  cl_uint numSubDevices;
  _cl_device_id *parent;
  cl_uint numDevices;
  cl_device_partition_property props [3];
  string deviceInfo;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> parentDevices;
  cl_uint local_dc;
  _cl_device_id *local_d8;
  cl_int local_cc;
  _cl_device_id **local_c8;
  iterator iStack_c0;
  _cl_device_id **local_b8;
  cl_uint local_b0;
  cl_uint local_ac;
  cl_device_partition_property local_a8;
  ulong uStack_a0;
  undefined8 local_98;
  cl_uint *local_88;
  pthread_mutex_t *local_80;
  string local_78;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> local_58;
  cl_device_id *local_38;
  
  local_88 = num_devices;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar3 != 0) {
    uVar7 = std::__throw_system_error(iVar3);
    if (local_c8 != (_cl_device_id **)0x0) {
      operator_delete(local_c8);
    }
    if (local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    pthread_mutex_unlock(local_80);
    _Unwind_Resume(uVar7);
  }
  local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_start = (cl_device_id *)0x0;
  local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (cl_device_id *)0x0;
  local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = (_cl_device_id **)0x0;
  local_c8 = (_cl_device_id **)0x0;
  iStack_c0._M_current = (_cl_device_id **)0x0;
  local_b0 = 0;
  local_80 = (pthread_mutex_t *)&this->m_Mutex;
  local_cc = (*(this->m_Dispatch).clGetDeviceIDs)
                       (platform,device_type,0,(cl_device_id *)0x0,&local_b0);
  local_ac = num_entries;
  local_38 = devices;
  if (local_b0 != 0 && local_cc == 0) {
    std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
              (&local_58,(ulong)local_b0);
    local_cc = (*(this->m_Dispatch).clGetDeviceIDs)
                         (platform,device_type,local_b0,
                          local_58.
                          super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
  }
  pp_Var1 = local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pp_Var10 = local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      local_d8 = *pp_Var10;
      this_00 = std::
                map<_cl_device_id_*,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>_>_>
                ::operator[](&this->m_SubDeviceCacheMap,&local_d8);
      pp_Var4 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pp_Var8 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      if (pp_Var4 == pp_Var8) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        getDeviceInfoString(this,1,&local_d8,&local_78);
        pp_Var4 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pp_Var8 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        __x_01 = extraout_XMM0_Da;
        if (pp_Var8 == pp_Var4) {
          if ((this->m_Config).AutoPartitionByAffinityDomain == true) {
            local_a8 = 0x1088;
            uStack_a0 = 0x20;
            local_98 = 0;
            local_dc = 0;
            (*(this->m_Dispatch).clCreateSubDevices)
                      (local_d8,&local_a8,0,(cl_device_id *)0x0,&local_dc);
            __x_01 = __x;
            if (1 < local_dc) {
              logf(this,__x);
              std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
                        (this_00,(ulong)local_dc);
              (*(this->m_Dispatch).clCreateSubDevices)
                        (local_d8,&local_a8,local_dc,
                         (this_00->
                         super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                         _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
              __x_01 = extraout_XMM0_Da_00;
            }
            pp_Var4 = (this_00->
                      super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pp_Var8 = (this_00->
                      super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
            goto LAB_0016f102;
          }
LAB_0016f10b:
          uVar6 = (ulong)(this->m_Config).AutoPartitionEqually;
          if (uVar6 != 0) {
            local_a8 = 0x1086;
            local_98 = 0;
            local_dc = 0;
            uStack_a0 = uVar6;
            (*(this->m_Dispatch).clCreateSubDevices)
                      (local_d8,&local_a8,0,(cl_device_id *)0x0,&local_dc);
            __x_01 = __x_00;
            if (1 < local_dc) {
              logf(this,__x_00);
              std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
                        (this_00,(ulong)local_dc);
              (*(this->m_Dispatch).clCreateSubDevices)
                        (local_d8,&local_a8,local_dc,
                         (this_00->
                         super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                         _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
              __x_01 = extraout_XMM0_Da_01;
            }
            pp_Var4 = (this_00->
                      super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pp_Var8 = (this_00->
                      super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
            goto LAB_0016f1c1;
          }
LAB_0016f1c6:
          logf(this,__x_01);
        }
        else {
LAB_0016f102:
          if (pp_Var8 == pp_Var4) goto LAB_0016f10b;
LAB_0016f1c1:
          if (pp_Var8 == pp_Var4) goto LAB_0016f1c6;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        pp_Var4 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pp_Var8 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      if (pp_Var8 == pp_Var4) {
LAB_0016f287:
        p_Var5 = local_d8;
        pp_Var4 = &local_d8;
        if (iStack_c0._M_current == local_b8) {
LAB_0016f2a6:
          std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>::
          _M_realloc_insert<_cl_device_id*const&>
                    ((vector<_cl_device_id*,std::allocator<_cl_device_id*>> *)&local_c8,iStack_c0,
                     pp_Var4);
        }
        else {
LAB_0016f298:
          *iStack_c0._M_current = p_Var5;
          iStack_c0._M_current = iStack_c0._M_current + 1;
        }
      }
      else {
        bVar2 = (this->m_Config).AutoPartitionAllDevices;
        if ((bool)bVar2 == true) {
          if (iStack_c0._M_current == local_b8) {
            std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>::
            _M_realloc_insert<_cl_device_id*const&>
                      ((vector<_cl_device_id*,std::allocator<_cl_device_id*>> *)&local_c8,iStack_c0,
                       &local_d8);
            bVar2 = (this->m_Config).AutoPartitionAllDevices;
          }
          else {
            *iStack_c0._M_current = local_d8;
            iStack_c0._M_current = iStack_c0._M_current + 1;
          }
        }
        if (((bVar2 & 1) == 0) && ((this->m_Config).AutoPartitionAllSubDevices != true)) {
          if ((this->m_Config).AutoPartitionSingleSubDevice != true) goto LAB_0016f287;
          pp_Var4 = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          if (iStack_c0._M_current == local_b8) goto LAB_0016f2a6;
          p_Var5 = *pp_Var4;
          goto LAB_0016f298;
        }
        std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<_cl_device_id**,std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>>>
                  ((vector<_cl_device_id*,std::allocator<_cl_device_id*>> *)&local_c8,
                   iStack_c0._M_current,
                   (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      pp_Var10 = pp_Var10 + 1;
    } while (pp_Var10 != pp_Var1);
  }
  __mutex = local_80;
  if (local_cc == 0) {
    uVar6 = (long)iStack_c0._M_current - (long)local_c8 >> 3;
    if (iStack_c0._M_current != local_c8) {
      uVar9 = 0;
      do {
        if ((uint)uVar9 < local_ac) {
          local_38[uVar9] = local_c8[uVar9];
        }
        uVar9 = uVar9 + 1;
      } while ((uVar9 & 0xffffffff) < uVar6);
    }
    if (local_88 != (cl_uint *)0x0) {
      *local_88 = (cl_uint)uVar6;
    }
  }
  if (local_c8 != (_cl_device_id **)0x0) {
    operator_delete(local_c8);
  }
  if (local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
      super__Vector_impl_data._M_start != (cl_device_id *)0x0) {
    operator_delete(local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock(__mutex);
  return local_cc;
}

Assistant:

cl_int CLIntercept::autoPartitionGetDeviceIDs(
    cl_platform_id platform,
    cl_device_type device_type,
    cl_uint num_entries,
    cl_device_id* devices,
    cl_uint* num_devices )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().AutoPartitionAllDevices ||
                config().AutoPartitionAllSubDevices ||
                config().AutoPartitionSingleSubDevice );

    cl_int  errorCode = CL_SUCCESS;
    std::vector<cl_device_id>   parentDevices;
    std::vector<cl_device_id>   returnedDevices;

    cl_uint numDevices = 0;
    errorCode = dispatch().clGetDeviceIDs(
        platform,
        device_type,
        0,
        NULL,
        &numDevices );
    if( errorCode == CL_SUCCESS && numDevices != 0 )
    {
        parentDevices.resize(numDevices);
        errorCode = dispatch().clGetDeviceIDs(
            platform,
            device_type,
            numDevices,
            parentDevices.data(),
            NULL );
    }

    for( auto parent : parentDevices )
    {
        std::vector<cl_device_id>&  subDevices = m_SubDeviceCacheMap[parent];

        if( subDevices.empty() )
        {
            std::string deviceInfo;
            getDeviceInfoString(
                1,
                &parent,
                deviceInfo );

            if( subDevices.size() == 0 &&
                config().AutoPartitionByAffinityDomain )
            {
                const cl_device_partition_property props[] = {
                    CL_DEVICE_PARTITION_BY_AFFINITY_DOMAIN,
                    CL_DEVICE_AFFINITY_DOMAIN_NEXT_PARTITIONABLE,
                    0
                };

                cl_uint numSubDevices = 0;
                dispatch().clCreateSubDevices(
                    parent,
                    props,
                    0,
                    NULL,
                    &numSubDevices );
                if( numSubDevices > 1 )
                {
                    logf("Partitioned device %s by affinity domain into %u sub-devices.\n",
                        deviceInfo.c_str(),
                        numSubDevices );

                    subDevices.resize(numSubDevices);
                    dispatch().clCreateSubDevices(
                        parent,
                        props,
                        numSubDevices,
                        subDevices.data(),
                        NULL );
                }
            }

            if( subDevices.size() == 0 &&
                config().AutoPartitionEqually )
            {
                const cl_device_partition_property props[] = {
                    CL_DEVICE_PARTITION_EQUALLY,
                    (cl_device_partition_property)config().AutoPartitionEqually,
                    0
                };

                cl_uint numSubDevices = 0;
                dispatch().clCreateSubDevices(
                    parent,
                    props,
                    0,
                    NULL,
                    &numSubDevices );
                if( numSubDevices > 1 )
                {
                    logf("Partitioned device %s equally into %u sub-devices with %u compute unit%s.\n",
                        deviceInfo.c_str(),
                        numSubDevices,
                        config().AutoPartitionEqually,
                        config().AutoPartitionEqually > 1 ? "s" : "" );

                    subDevices.resize(numSubDevices);
                    dispatch().clCreateSubDevices(
                        parent,
                        props,
                        numSubDevices,
                        subDevices.data(),
                        NULL );
                }
            }

            if( subDevices.size() == 0 )
            {
                logf("Couldn't partition device %s.\n",
                    deviceInfo.c_str() );
            }
        }

        if( subDevices.size() == 0 )
        {
            returnedDevices.push_back(parent);
        }
        else
        {
            if( config().AutoPartitionAllDevices )
            {
                returnedDevices.push_back(parent);
            }
            if( config().AutoPartitionAllDevices ||
                config().AutoPartitionAllSubDevices )
            {
                returnedDevices.insert(
                    returnedDevices.end(),
                    subDevices.begin(),
                    subDevices.end() );
            }
            else if( config().AutoPartitionSingleSubDevice )
            {
                returnedDevices.push_back( subDevices.front() );
            }
            else
            {
                CLI_ASSERT( 0 );
                returnedDevices.push_back( parent );
            }
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        for( cl_uint d = 0; d < returnedDevices.size(); d++ )
        {
            if( d < num_entries )
            {
                devices[d] = returnedDevices[d];
            }
        }

        if( num_devices )
        {
            num_devices[0] = (cl_uint)returnedDevices.size();
        }
    }

    return errorCode;
}